

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonevector.h
# Opt level: O3

Error __thiscall asmjit::_abi_1_10::CodeHolder::flatten(CodeHolder *this)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar4 = (ulong)(this->_sectionsByOrder).super_ZoneVectorBase._size;
  if (uVar4 != 0) {
    pvVar1 = (this->_sectionsByOrder).super_ZoneVectorBase._data;
    lVar5 = 0;
    uVar8 = 0;
    do {
      lVar3 = *(long *)((long)pvVar1 + lVar5);
      uVar6 = *(ulong *)(lVar3 + 0x50);
      if (*(ulong *)(lVar3 + 0x50) < *(ulong *)(lVar3 + 0x18)) {
        uVar6 = *(ulong *)(lVar3 + 0x18);
      }
      if (uVar6 != 0) {
        uVar7 = -(ulong)*(uint *)(lVar3 + 8) & (uVar8 + *(uint *)(lVar3 + 8)) - 1;
        if (uVar7 < uVar8) {
          return 9;
        }
        uVar8 = uVar7 + uVar6;
        if (CARRY8(uVar7,uVar6)) {
          return 9;
        }
      }
      lVar5 = lVar5 + 8;
    } while (uVar4 * 8 - lVar5 != 0);
    if (uVar4 != 0) {
      lVar3 = 0;
      uVar8 = 0;
      lVar5 = 0;
      do {
        lVar2 = *(long *)((long)pvVar1 + lVar3);
        uVar6 = *(ulong *)(lVar2 + 0x50);
        if (*(ulong *)(lVar2 + 0x50) < *(ulong *)(lVar2 + 0x18)) {
          uVar6 = *(ulong *)(lVar2 + 0x18);
        }
        if (uVar6 != 0) {
          uVar8 = -(ulong)*(uint *)(lVar2 + 8) & (uVar8 + *(uint *)(lVar2 + 8)) - 1;
        }
        *(ulong *)(lVar2 + 0x10) = uVar8;
        if (lVar5 != 0) {
          *(ulong *)(lVar5 + 0x18) = uVar8 - *(long *)(lVar5 + 0x10);
        }
        uVar8 = uVar8 + uVar6;
        lVar3 = lVar3 + 8;
        lVar5 = lVar2;
      } while (uVar4 * 8 - lVar3 != 0);
    }
  }
  return 0;
}

Assistant:

inline iterator end() noexcept { return iterator(data() + _size); }